

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  xml_encoding xVar4;
  value_type vVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  xml_node_struct *pxVar9;
  xml_attribute_struct *pxVar10;
  byte *pbVar11;
  xml_node_struct **ppxVar12;
  byte bVar13;
  byte bVar14;
  ushort uVar15;
  ushort *puVar16;
  byte *pbVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  size_t data_length;
  ulong uVar21;
  xml_allocator *alloc;
  ushort *puVar22;
  ulong uVar23;
  byte bVar24;
  ushort uVar25;
  xml_parse_status xVar26;
  long lVar27;
  long lVar28;
  type *data;
  byte *pbVar29;
  size_t sVar30;
  byte *pbVar31;
  byte *pbVar32;
  byte *pbVar33;
  byte *pbVar34;
  size_t __n;
  bool bVar35;
  long lStack_d0;
  xml_node_struct *local_a8;
  byte *local_88;
  xml_node_struct *local_70;
  auto_deleter<void> contents_guard;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return __return_storage_ptr__;
  }
  xVar4 = get_buffer_encoding(encoding,contents,size);
  contents_guard.data = (void *)0x0;
  if (own) {
    contents_guard.data = contents;
  }
  contents_guard.deleter =
       (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  pbVar11 = (byte *)contents;
  if (xVar4 != encoding_utf8) {
    if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
      uVar21 = size >> 1;
      if (xVar4 == encoding_utf16_le) {
        lVar18 = 0;
        lVar20 = -1;
        puVar22 = (ushort *)contents;
        for (uVar23 = uVar21; uVar23 != 0; uVar23 = uVar23 + lVar28) {
          uVar15 = *puVar22;
          lVar28 = lVar20;
          if (uVar15 < 0xd800) {
            lVar27 = 3 - (ulong)(uVar15 < 0x800);
            if (uVar15 < 0x80) {
              lVar27 = 1;
            }
            lVar18 = lVar18 + lVar27;
LAB_0011ffce:
            puVar16 = puVar22 + 1;
          }
          else {
            if ((~uVar15 & 0xe000) == 0) {
              lVar18 = lVar18 + 3;
              goto LAB_0011ffce;
            }
            puVar16 = puVar22 + 1;
            if (((uVar23 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar16 & 0xfc00) == 0xdc00))
            {
              lVar18 = lVar18 + 4;
              puVar16 = puVar22 + 2;
              lVar28 = -2;
            }
          }
          puVar22 = puVar16;
        }
        sVar30 = lVar18 + 1;
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(sVar30);
        if (pbVar11 != (byte *)0x0) {
          lVar20 = -1;
          pbVar29 = pbVar11;
          puVar22 = (ushort *)contents;
          for (; uVar21 != 0; uVar21 = uVar21 + lStack_d0) {
            uVar15 = *puVar22;
            uVar19 = (uint)uVar15;
            lStack_d0 = lVar20;
            if ((uVar15 < 0xd800) || ((~uVar15 & 0xe000) == 0)) {
              pbVar29 = utf8_writer::low(pbVar29,uVar19);
              puVar16 = puVar22 + 1;
            }
            else {
              puVar16 = puVar22 + 1;
              if (((uVar21 != 1) && ((uVar19 & 0xfc00) == 0xd800)) &&
                 ((*puVar16 & 0xfc00) == 0xdc00)) {
                pbVar29 = utf8_writer::high(pbVar29,(uVar19 & 0x3ff) * 0x400 + (*puVar16 & 0x3ff) +
                                                    0x10000);
                puVar16 = puVar22 + 2;
                lStack_d0 = -2;
              }
            }
            puVar22 = puVar16;
          }
LAB_00120313:
          *pbVar29 = 0;
          size = sVar30;
          goto LAB_00120316;
        }
      }
      else {
        lVar20 = -1;
        lVar18 = 0;
        puVar22 = (ushort *)contents;
        for (uVar23 = uVar21; uVar23 != 0; uVar23 = uVar23 + lVar28) {
          uVar15 = *puVar22 << 8;
          uVar25 = uVar15 | *puVar22 >> 8;
          lVar28 = lVar20;
          if (uVar25 < 0xd800) {
            lVar27 = 3 - (ulong)(uVar25 < 0x800);
            if (uVar25 < 0x80) {
              lVar27 = 1;
            }
            lVar18 = lVar18 + lVar27;
LAB_00120106:
            puVar16 = puVar22 + 1;
          }
          else {
            if ((~uVar25 & 0xe000) == 0) {
              lVar18 = lVar18 + 3;
              goto LAB_00120106;
            }
            puVar16 = puVar22 + 1;
            if (((uVar23 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar16 & 0xfc) == 0xdc)) {
              lVar18 = lVar18 + 4;
              puVar16 = puVar22 + 2;
              lVar28 = -2;
            }
          }
          puVar22 = puVar16;
        }
        sVar30 = lVar18 + 1;
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(sVar30);
        if (pbVar11 != (byte *)0x0) {
          lVar20 = -1;
          pbVar29 = pbVar11;
          puVar22 = (ushort *)contents;
          for (; uVar21 != 0; uVar21 = uVar21 + lStack_d0) {
            uVar15 = *puVar22 << 8 | *puVar22 >> 8;
            uVar19 = (uint)uVar15;
            lStack_d0 = lVar20;
            if ((uVar15 < 0xd800) || ((~uVar19 & 0xe000) == 0)) {
              pbVar29 = utf8_writer::low(pbVar29,uVar19);
              puVar16 = puVar22 + 1;
            }
            else {
              puVar16 = puVar22 + 1;
              if (((uVar21 != 1) && ((uVar19 & 0xfc00) == 0xd800)) &&
                 (uVar19 = (uint)(ushort)(*puVar16 << 8 | *puVar16 >> 8),
                 (uVar19 & 0xfc00) == 0xdc00)) {
                pbVar29 = utf8_writer::high(pbVar29,(uVar15 & 0x3ff) * 0x400 + (uVar19 & 0x3ff) +
                                                    0x10000);
                puVar16 = puVar22 + 2;
                lStack_d0 = -2;
              }
            }
            puVar22 = puVar16;
          }
          goto LAB_00120313;
        }
      }
    }
    else if (xVar4 - encoding_utf32_le < 2) {
      uVar21 = size >> 2;
      if (xVar4 == encoding_utf32_le) {
        vVar5 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,uVar21);
        sVar30 = vVar5 + 1;
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(sVar30);
        if (pbVar11 != (byte *)0x0) {
          pbVar29 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                    process<pugi::impl::(anonymous_namespace)::utf8_writer>(contents,uVar21,pbVar11)
          ;
          goto LAB_00120313;
        }
      }
      else {
        lVar20 = 0;
        for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
          uVar19 = *(uint *)((long)contents + uVar23 * 4);
          uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                   uVar19 << 0x18;
          if (uVar19 < 0x10000) {
            lVar18 = 3 - (ulong)(uVar19 < 0x800);
            if (uVar19 < 0x80) {
              lVar18 = 1;
            }
            lVar20 = lVar20 + lVar18;
          }
          else {
            lVar20 = lVar20 + 4;
          }
        }
        sVar30 = lVar20 + 1;
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(sVar30);
        if (pbVar11 != (byte *)0x0) {
          pbVar29 = pbVar11;
          for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
            uVar19 = *(uint *)((long)contents + uVar23 * 4);
            uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18;
            if (uVar19 < 0x10000) {
              pbVar29 = utf8_writer::low(pbVar29,uVar19);
            }
            else {
              pbVar29 = utf8_writer::high(pbVar29,uVar19);
            }
          }
          goto LAB_00120313;
        }
      }
    }
    else if (xVar4 == encoding_latin1) {
      lVar20 = 0;
      pcVar6 = (char *)contents;
LAB_00120222:
      if (size + lVar20 != 0) {
        if (-1 < *pcVar6) goto code_r0x00120237;
        lVar18 = 0;
        __n = -lVar20;
        for (sVar7 = __n; size != sVar7; sVar7 = sVar7 + 1) {
          lVar18 = (lVar18 - (ulong)(-1 < *(char *)((long)contents + sVar7))) + 2;
        }
        sVar30 = (lVar18 - lVar20) + 1;
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(sVar30);
        if (pbVar11 != (byte *)0x0) {
          memcpy(pbVar11,contents,__n);
          pbVar29 = pbVar11 + -lVar20;
          for (; size != __n; __n = __n + 1) {
            pbVar29 = utf8_writer::low(pbVar29,(uint)*(byte *)((long)contents + __n));
          }
          goto LAB_00120313;
        }
        goto LAB_00121268;
      }
      if (!is_mutable) {
        pbVar11 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(size + 1)
        ;
        goto LAB_0012002c;
      }
      goto LAB_00120316;
    }
LAB_00121268:
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_out_of_memory;
    __return_storage_ptr__->offset = 0;
    goto LAB_00121437;
  }
  if (!is_mutable) {
    pbVar11 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(size + 1);
LAB_0012002c:
    sVar30 = size + 1;
    if (pbVar11 != (byte *)0x0) {
      if (contents != (void *)0x0) {
        memcpy(pbVar11,contents,size);
      }
      pbVar29 = pbVar11 + size;
      goto LAB_00120313;
    }
    goto LAB_00121268;
  }
LAB_00120316:
  contents_guard.data = (void *)0x0;
  if (own) {
    if ((contents != (void *)0x0) && (pbVar11 != (byte *)contents)) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_0012033b:
    *out_buffer = (char_t *)pbVar11;
  }
  else if (pbVar11 != (byte *)contents) goto LAB_0012033b;
  doc->buffer = (char_t *)pbVar11;
  if (size != 0) {
    if (root->first_child == (xml_node_struct *)0x0) {
      local_70 = (xml_node_struct *)0x0;
    }
    else {
      local_70 = root->first_child->prev_sibling_c;
    }
    bVar1 = pbVar11[size - 1];
    pbVar11[size - 1] = 0;
    local_88 = pbVar11;
    if ((*pbVar11 == 0xef) && (pbVar11[1] == 0xbb)) {
      local_88 = pbVar11 + (ulong)(pbVar11[2] == 0xbf) * 3;
    }
    alloc = &doc->super_xml_allocator;
    pcVar2 = *(code **)((long)&PTR_parse_simple_0013fc68 + (ulong)(options >> 1 & 0x78));
    pcVar3 = (code *)(&PTR_parse_0013fce8)[options >> 9 & 4 | options >> 4 & 3];
    bVar24 = bVar1 ^ 0x3e;
    pbVar29 = local_88;
    local_a8 = root;
LAB_0012045e:
    do {
      bVar13 = *pbVar29;
      do {
        pbVar31 = pbVar29;
        if (bVar13 == 0) goto LAB_001211ad;
        pbVar29 = pbVar31;
        if (bVar13 == 0x3c) goto LAB_001204f4;
        while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0) {
          bVar13 = pbVar29[1];
          pbVar29 = pbVar29 + 1;
        }
      } while (((bVar13 == 0x3c) || (bVar13 == 0)) &&
              (((options >> 0xb & 1) != 0 || (options & 0x408) == 0 ||
               (((options >> 10 & 1) != 0 &&
                (((bVar13 != 0x3c || (pbVar29[1] != 0x2f)) ||
                 (local_a8->first_child != (xml_node_struct *)0x0))))))));
      if ((options >> 0xb & 1) != 0) {
        pbVar31 = pbVar29;
      }
      if (((options >> 0xc & 1) != 0) || (local_a8->parent != (xml_node_struct *)0x0)) {
        pbVar32 = (byte *)(*pcVar3)(pbVar31);
        if ((((options >> 0xd & 1) == 0) ||
            ((local_a8->parent == (xml_node_struct *)0x0 ||
             (local_a8->first_child != (xml_node_struct *)0x0)))) ||
           (local_a8->value != (char_t *)0x0)) {
          if ((((options >> 0xe & 1) != 0) && (local_a8->first_child != (xml_node_struct *)0x0)) &&
             ((local_a8->first_child->prev_sibling_c->header & 0xf) == 3)) {
            sVar7 = strlen((char *)local_88);
            sVar8 = strlen((char *)pbVar31);
            memmove(local_88 + sVar7,pbVar31,sVar8 + 1);
            local_88 = local_88 + sVar7 + sVar8;
            goto LAB_001205b7;
          }
          pxVar9 = append_new_node(local_a8,alloc,node_pcdata);
          if (pxVar9 != (xml_node_struct *)0x0) {
            pxVar9->value = (char_t *)pbVar31;
            local_88 = pbVar31;
            goto LAB_001205b7;
          }
          goto LAB_001212a8;
        }
        local_a8->value = (char_t *)pbVar31;
LAB_001205b7:
        bVar13 = *pbVar32;
        pbVar31 = pbVar32;
        if (bVar13 != 0) goto LAB_001205c2;
LAB_001211ad:
        pbVar29 = (byte *)0x0;
        if (local_a8 != root) {
          pbVar29 = pbVar31;
        }
        xVar26 = status_end_element_mismatch;
        if (local_a8 == root) {
          xVar26 = status_ok;
        }
        goto LAB_0012139c;
      }
      while( true ) {
        if (*pbVar31 == 0) goto LAB_001211ad;
        if (*pbVar31 == 0x3c) break;
        pbVar31 = pbVar31 + 1;
      }
LAB_001204f4:
      bVar13 = pbVar31[1];
      pbVar32 = pbVar31 + 1;
LAB_001205c2:
      if (-1 < (char)(anonymous_namespace)::chartype_table[bVar13]) {
        if (bVar13 == 0x21) {
          bVar13 = pbVar32[1];
          if (bVar13 == 0x5b) {
            if (pbVar32[2] == 0x43) {
              if (pbVar32[3] == 0x44) {
                if (pbVar32[4] == 0x41) {
                  if (pbVar32[5] == 0x54) {
                    if (pbVar32[6] == 0x41) {
                      if (pbVar32[7] == 0x5b) {
                        pbVar32 = pbVar32 + 8;
                        pbVar29 = pbVar32;
                        if ((options & 4) == 0) {
                          do {
                            if (*pbVar29 == 0x5d) {
                              if (pbVar29[1] == 0x5d) {
                                if ((pbVar29[2] == 0x3e) || (bVar24 == 0 && pbVar29[2] == 0))
                                goto LAB_00121093;
                              }
                            }
                            else if (*pbVar29 == 0) goto LAB_00121384;
                            pbVar29 = pbVar29 + 1;
                          } while( true );
                        }
                        pxVar9 = append_new_node(local_a8,alloc,node_cdata);
                        if (pxVar9 != (xml_node_struct *)0x0) {
                          pxVar9->value = (char_t *)pbVar32;
                          if ((options & 0x20) != 0) {
                            lVar20 = 0;
                            pbVar31 = (byte *)0x0;
LAB_00120dab:
                            do {
                              pbVar29 = pbVar32 + 3;
                              while (bVar13 = pbVar29[-3],
                                    ((anonymous_namespace)::chartype_table[bVar13] & 0x10) == 0) {
                                bVar13 = pbVar29[-2];
                                if (((anonymous_namespace)::chartype_table[bVar13] & 0x10) != 0) {
                                  pbVar29 = pbVar29 + -2;
                                  goto LAB_00120df2;
                                }
                                bVar13 = pbVar29[-1];
                                if (((anonymous_namespace)::chartype_table[bVar13] & 0x10) != 0) {
                                  pbVar29 = pbVar29 + -1;
                                  goto LAB_00120df2;
                                }
                                bVar13 = *pbVar29;
                                if (((anonymous_namespace)::chartype_table[bVar13] & 0x10) != 0)
                                goto LAB_00120df2;
                                pbVar29 = pbVar29 + 4;
                              }
                              pbVar29 = pbVar29 + -3;
LAB_00120df2:
                              if (bVar13 == 0xd) {
                                pbVar32 = pbVar29 + 1;
                                *pbVar29 = 10;
                                if (pbVar29[1] == 10) {
                                  if (pbVar31 != (byte *)0x0) {
                                    memmove(pbVar31 + -lVar20,pbVar31,(long)pbVar32 - (long)pbVar31)
                                    ;
                                  }
                                  pbVar32 = pbVar29 + 2;
                                  lVar20 = lVar20 + 1;
                                  pbVar31 = pbVar32;
                                }
                                goto LAB_00120dab;
                              }
                              if (bVar13 == 0x5d) {
                                if ((pbVar29[1] == 0x5d) &&
                                   ((pbVar29[2] == 0x3e || (bVar24 == 0 && pbVar29[2] == 0))))
                                goto LAB_0012106e;
                              }
                              else if (bVar13 == 0) {
                                pbVar29 = (byte *)pxVar9->value;
                                goto LAB_00121384;
                              }
                              pbVar32 = pbVar29 + 1;
                            } while( true );
                          }
                          do {
                            if (*pbVar29 == 0x5d) {
                              if (pbVar29[1] == 0x5d) {
                                if ((pbVar29[2] == 0x3e) || (bVar24 == 0 && pbVar29[2] == 0))
                                goto LAB_00121065;
                              }
                            }
                            else if (*pbVar29 == 0) goto LAB_00121384;
                            pbVar29 = pbVar29 + 1;
                          } while( true );
                        }
                        goto LAB_001212a8;
                      }
                      pbVar29 = pbVar32 + 7;
                    }
                    else {
                      pbVar29 = pbVar32 + 6;
                    }
                  }
                  else {
                    pbVar29 = pbVar32 + 5;
                  }
                }
                else {
                  pbVar29 = pbVar32 + 4;
                }
              }
              else {
                pbVar29 = pbVar32 + 3;
              }
            }
            else {
              pbVar29 = pbVar32 + 2;
            }
LAB_00121384:
            xVar26 = status_bad_cdata;
          }
          else {
            pbVar29 = pbVar32 + 1;
            if (bVar13 == 0x44) {
              if ((((pbVar32[2] == 0x4f) && (pbVar32[3] == 0x43)) && (pbVar32[4] == 0x54)) &&
                 ((pbVar32[5] == 0x59 && (pbVar32[6] == 0x50)))) {
                if ((pbVar32[7] != 0x45) && (bVar1 != 0x45 || pbVar32[7] != 0)) goto LAB_001212c5;
                if (local_a8->parent == (xml_node_struct *)0x0) {
                  bVar13 = 0x44;
                  lVar20 = 0;
LAB_00120aaa:
                  if ((bVar13 == 0x22) || (bVar13 == 0x27)) {
                    pbVar31 = pbVar29 + 1;
                    do {
                      pbVar29 = pbVar31;
                      bVar14 = *pbVar29;
                      pbVar31 = pbVar29 + 1;
                      if (bVar14 == 0) break;
                    } while (bVar14 != bVar13);
                    if (bVar14 == 0) goto LAB_0012138e;
                  }
                  else {
                    if (bVar13 == 0x3c) {
                      if (pbVar29[1] == 0x3f) {
                        pbVar29 = pbVar29 + 2;
                        do {
                          if (*pbVar29 == 0x3f) {
                            if (pbVar29[1] == 0x3e) goto LAB_00120ba7;
                          }
                          else if (*pbVar29 == 0) goto LAB_0012138e;
                          pbVar29 = pbVar29 + 1;
                        } while( true );
                      }
                      if (pbVar29[1] == 0x21) {
                        if (pbVar29[2] != 0x2d) {
                          if (pbVar29[2] == 0x5b) {
                            pbVar31 = pbVar29 + 3;
                            lVar18 = 0;
LAB_00120b2c:
                            pbVar31 = pbVar31 + 3;
                            do {
                              bVar13 = pbVar31[-3];
                              if (bVar13 == 0x3c) {
                                if ((pbVar31[-2] == 0x21) && (pbVar31[-1] == 0x5b)) {
                                  lVar18 = lVar18 + 1;
                                  goto LAB_00120b2c;
                                }
                              }
                              else if (bVar13 == 0x5d) {
                                if ((pbVar31[-2] == 0x5d) && (pbVar31[-1] == 0x3e))
                                goto LAB_00120b70;
                              }
                              else if (bVar13 == 0) {
                                pbVar29 = pbVar31 + -3;
                                goto LAB_0012138e;
                              }
                              pbVar31 = pbVar31 + 1;
                            } while( true );
                          }
                          pbVar31 = pbVar29 + 2;
                          lVar20 = lVar20 + 1;
                          goto LAB_00120af4;
                        }
                        if (pbVar29[3] == 0x2d) {
                          pbVar29 = pbVar29 + 4;
                          do {
                            if (*pbVar29 == 0x2d) {
                              if ((pbVar29[1] == 0x2d) && (pbVar29[2] == 0x3e)) goto LAB_00120bf4;
                            }
                            else if (*pbVar29 == 0) break;
                            pbVar29 = pbVar29 + 1;
                          } while( true );
                        }
                      }
                      goto LAB_0012138e;
                    }
                    if (bVar13 == 0x3e) {
                      if (lVar20 == 0) {
                        *pbVar29 = 0;
                        pbVar29 = pbVar29 + 1;
                        goto LAB_001210c6;
                      }
                      lVar20 = lVar20 + -1;
                    }
                    else if (bVar13 == 0) goto LAB_001210a9;
                    pbVar31 = pbVar29 + 1;
                  }
                  goto LAB_00120af4;
                }
                pbVar29 = pbVar32 + -1;
                goto LAB_0012138e;
              }
LAB_001212c5:
              xVar26 = status_unrecognized_tag;
            }
            else if (bVar13 == 0x2d) {
              if (pbVar32[2] == 0x2d) {
                pbVar32 = pbVar32 + 3;
                pxVar9 = local_a8;
                if ((options & 2) == 0) {
LAB_001207d5:
                  pbVar29 = pbVar32;
                  if ((options & 0x22) != 0x22) {
                    do {
                      if (*pbVar29 == 0x2d) {
                        if (pbVar29[1] == 0x2d) {
                          bVar13 = pbVar29[2];
                          if ((bVar13 == 0x3e) || (bVar24 == 0 && bVar13 == 0)) goto LAB_00120fcc;
                        }
                      }
                      else if (*pbVar29 == 0) goto LAB_0012135b;
                      pbVar29 = pbVar29 + 1;
                    } while( true );
                  }
                  pbVar29 = (byte *)0x0;
                  lVar20 = 0;
LAB_001207e5:
                  do {
                    pbVar31 = pbVar32 + 3;
                    while (bVar13 = pbVar31[-3],
                          ((anonymous_namespace)::chartype_table[bVar13] & 0x20) == 0) {
                      bVar13 = pbVar31[-2];
                      if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0) {
                        pbVar31 = pbVar31 + -2;
                        goto LAB_0012082d;
                      }
                      bVar13 = pbVar31[-1];
                      if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0) {
                        pbVar31 = pbVar31 + -1;
                        goto LAB_0012082d;
                      }
                      bVar13 = *pbVar31;
                      if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0)
                      goto LAB_0012082d;
                      pbVar31 = pbVar31 + 4;
                    }
                    pbVar31 = pbVar31 + -3;
LAB_0012082d:
                    if (bVar13 == 0xd) {
                      *pbVar31 = 10;
                      pbVar32 = pbVar31 + 1;
                      if (pbVar31[1] == 10) {
                        if (pbVar29 != (byte *)0x0) {
                          memmove(pbVar29 + -lVar20,pbVar29,(long)(pbVar31 + 1) - (long)pbVar29);
                        }
                        pbVar29 = pbVar31 + 2;
                        lVar20 = lVar20 + 1;
                        pbVar32 = pbVar29;
                      }
                      goto LAB_001207e5;
                    }
                    if (bVar13 == 0x2d) {
                      if ((pbVar31[1] == 0x2d) &&
                         ((pbVar31[2] == 0x3e || (bVar24 == 0 && pbVar31[2] == 0))))
                      goto LAB_00120feb;
                    }
                    else if (bVar13 == 0) {
                      pbVar29 = (byte *)pxVar9->value;
                      goto LAB_0012135b;
                    }
                    pbVar32 = pbVar31 + 1;
                  } while( true );
                }
                pxVar9 = append_new_node(local_a8,alloc,node_comment);
                if (pxVar9 != (xml_node_struct *)0x0) {
                  pxVar9->value = (char_t *)pbVar32;
                  goto LAB_001207d5;
                }
                goto LAB_001212a8;
              }
              pbVar29 = pbVar32 + 2;
LAB_0012135b:
              xVar26 = status_bad_comment;
            }
            else if ((bVar1 == 0x2d) && (bVar13 == 0)) {
              xVar26 = status_bad_comment;
            }
            else {
              xVar26 = (uint)(bVar1 == 0x5b && bVar13 == 0) * 3 + status_unrecognized_tag;
            }
          }
        }
        else if (bVar13 == 0x3f) {
          pbVar31 = pbVar32 + 1;
          pbVar29 = pbVar31;
          if ((char)(anonymous_namespace)::chartype_table[pbVar32[1]] < '\0') {
            lVar20 = 4;
            pbVar29 = pbVar32 + 3;
            lVar18 = 1;
            pbVar33 = pbVar32 + 1;
            do {
              pbVar34 = pbVar33;
              lVar28 = lVar18;
              pbVar17 = pbVar29;
              uVar21 = (ulong)*pbVar34;
              pbVar33 = pbVar34 + 1;
              lVar20 = lVar20 + -1;
              pbVar29 = pbVar17 + 1;
              lVar18 = lVar28 + 1;
            } while (((anonymous_namespace)::chartype_table[uVar21] & 0x40) != 0);
            pbVar29 = pbVar34;
            if (*pbVar34 == 0) goto LAB_00121294;
            pbVar29 = pbVar32 + lVar28;
            if (((pbVar32[1] & 0xdf) == 0x58) && ((pbVar32[2] & 0xdf) == 0x4d)) {
              bVar35 = (pbVar32[3] & 0xdf) != 0x4c;
              uVar19 = 1;
              if (lVar20 == 0 && !bVar35) {
                uVar19 = 0x100;
              }
              if ((options & uVar19) == 0) {
LAB_001208f4:
                do {
                  if ((char)uVar21 == '?') {
                    bVar13 = pbVar34[1];
                    if ((bVar13 == 0x3e) || (bVar24 == 0 && bVar13 == 0)) goto LAB_00120d0d;
                  }
                  else {
                    pbVar29 = pbVar34;
                    if ((int)uVar21 == 0) goto LAB_00121294;
                    bVar13 = pbVar34[1];
                  }
                  uVar21 = (ulong)bVar13;
                  pbVar34 = pbVar34 + 1;
                } while( true );
              }
              if (lVar20 != 0 || bVar35) goto LAB_001209d3;
              if (local_a8->parent != (xml_node_struct *)0x0) goto LAB_00121294;
              local_a8 = append_new_node(local_a8,alloc,node_declaration);
              pbVar32 = pbVar29;
              if (local_a8 == (xml_node_struct *)0x0) goto LAB_001212a8;
              bVar35 = true;
            }
            else {
              if ((options & 1) == 0) goto LAB_001208f4;
LAB_001209d3:
              local_a8 = append_new_node(local_a8,alloc,node_pi);
              pbVar32 = pbVar29;
              if (local_a8 == (xml_node_struct *)0x0) goto LAB_001212a8;
              bVar35 = false;
            }
            local_a8->name = (char_t *)pbVar31;
            bVar13 = *pbVar34;
            *pbVar34 = 0;
            if ((ulong)bVar13 != 0x3f) {
              pbVar29 = pbVar33;
              if (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0) {
                do {
                  pbVar29 = pbVar17;
                  uVar21 = (ulong)pbVar34[1];
                  pbVar34 = pbVar34 + 1;
                  pbVar17 = pbVar29 + 1;
                } while (((anonymous_namespace)::chartype_table[uVar21] & 8) != 0);
                do {
                  if ((char)uVar21 == '?') {
                    bVar13 = *pbVar29;
                    if ((bVar13 == 0x3e) || (bVar24 == 0 && bVar13 == 0)) goto LAB_00120d8e;
                  }
                  else {
                    if ((int)uVar21 == 0) {
                      pbVar29 = pbVar29 + -1;
                      break;
                    }
                    bVar13 = *pbVar29;
                  }
                  uVar21 = (ulong)bVar13;
                  pbVar29 = pbVar29 + 1;
                } while( true );
              }
              goto LAB_00121294;
            }
            bVar13 = *pbVar33;
            if ((bVar13 != 0x3e) && (bVar24 != 0 || bVar13 != 0)) {
              pbVar29 = pbVar29 + 1;
              goto LAB_00121294;
            }
            pbVar34 = pbVar33 + (bVar13 == 0x3e);
            local_a8 = local_a8->parent;
            goto LAB_00120e94;
          }
LAB_00121294:
          xVar26 = status_bad_pi;
        }
        else if (bVar13 == 0x2f) {
          pbVar32 = pbVar32 + 1;
          pbVar31 = (byte *)local_a8->name;
          pbVar29 = pbVar32;
          if (pbVar31 == (byte *)0x0) {
LAB_001211cb:
            xVar26 = status_end_element_mismatch;
            pbVar29 = pbVar32;
          }
          else {
            while (bVar13 = *pbVar29, ((anonymous_namespace)::chartype_table[bVar13] & 0x40) != 0) {
              bVar14 = *pbVar31;
              pbVar31 = pbVar31 + 1;
              pbVar29 = pbVar29 + 1;
              if (bVar13 != bVar14) goto LAB_001211cb;
            }
            if (*pbVar31 == 0) goto code_r0x00120933;
            xVar26 = status_bad_end_element;
            if (((bVar13 != 0) || (*pbVar31 != bVar1)) || (pbVar31[1] != 0)) {
              xVar26 = status_end_element_mismatch;
              pbVar29 = pbVar32;
            }
          }
        }
        else {
          xVar26 = (bVar1 == 0x3f && bVar13 == 0) + status_unrecognized_tag;
          pbVar29 = pbVar32;
        }
        goto LAB_0012139c;
      }
      local_a8 = append_new_node(local_a8,alloc,node_element);
      if (local_a8 == (xml_node_struct *)0x0) goto LAB_001212a8;
      local_a8->name = (char_t *)pbVar32;
      pbVar29 = pbVar32 + 1;
      do {
        pbVar32 = pbVar29;
        uVar21 = (ulong)pbVar32[-1];
        bVar13 = (anonymous_namespace)::chartype_table[uVar21];
        if ((bVar13 & 0x40) == 0) {
          pbVar32 = pbVar32 + -1;
          goto LAB_00120970;
        }
        uVar21 = (ulong)*pbVar32;
        bVar13 = (anonymous_namespace)::chartype_table[uVar21];
        if ((bVar13 & 0x40) == 0) goto LAB_00120970;
        uVar21 = (ulong)pbVar32[1];
        bVar13 = (anonymous_namespace)::chartype_table[uVar21];
        if ((bVar13 & 0x40) == 0) {
          pbVar32 = pbVar32 + 1;
          goto LAB_00120970;
        }
        uVar21 = (ulong)pbVar32[2];
        bVar13 = (anonymous_namespace)::chartype_table[uVar21];
        pbVar29 = pbVar32 + 4;
      } while ((bVar13 & 0x40) != 0);
      pbVar32 = pbVar32 + 2;
LAB_00120970:
      *pbVar32 = 0;
      pbVar29 = pbVar32 + 1;
    } while ((char)uVar21 == '>');
    pbVar34 = pbVar29;
    if ((bVar13 & 8) != 0) goto LAB_00120ea7;
    if ((char)uVar21 == '\0') {
      pbVar29 = pbVar32;
      if (bVar1 == 0x3e) goto LAB_0012045e;
    }
    else {
      pbVar32 = pbVar29;
      if ((int)uVar21 == 0x2f) {
        bVar13 = *pbVar29;
        if ((bVar13 != 0x3e) && (bVar24 != 0 || bVar13 != 0)) goto LAB_0012147f;
        local_a8 = local_a8->parent;
        pbVar29 = pbVar29 + (bVar13 == 0x3e);
        goto LAB_0012045e;
      }
    }
    goto LAB_0012147f;
  }
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
  __return_storage_ptr__->offset = 0;
  goto LAB_0012142b;
code_r0x00120237:
  lVar20 = lVar20 + -1;
  pcVar6 = pcVar6 + 1;
  goto LAB_00120222;
LAB_0012106e:
  pbVar32 = pbVar29;
  if (pbVar31 != (byte *)0x0) {
    memmove(pbVar31 + -lVar20,pbVar31,(long)pbVar29 - (long)pbVar31);
    pbVar32 = pbVar29 + -lVar20;
  }
  *pbVar32 = 0;
LAB_00121093:
  pbVar29 = pbVar29 + (ulong)(pbVar29[2] == 0x3e) + 2;
  goto LAB_0012045e;
LAB_00121065:
  *pbVar29 = 0;
  goto LAB_00121093;
LAB_001210a9:
  if ((bVar1 != 0x3e) || (lVar20 != 0)) {
LAB_0012138e:
    xVar26 = status_bad_doctype;
    goto LAB_0012139c;
  }
LAB_001210c6:
  if ((options >> 9 & 1) != 0) {
    pbVar31 = pbVar32 + 7;
    do {
      pbVar32 = pbVar31 + 1;
      pbVar31 = pbVar31 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar32] & 8) != 0);
    pxVar9 = append_new_node(local_a8,alloc,node_doctype);
    pbVar32 = pbVar29;
    if (pxVar9 == (xml_node_struct *)0x0) {
LAB_001212a8:
      xVar26 = status_out_of_memory;
      pbVar29 = pbVar32;
      goto LAB_0012139c;
    }
    pxVar9->value = (char_t *)pbVar31;
  }
  goto LAB_0012045e;
LAB_00120ba7:
  pbVar31 = pbVar29 + 2;
  goto LAB_00120af4;
LAB_00120bf4:
  pbVar31 = pbVar29 + 3;
LAB_00120af4:
  bVar13 = *pbVar31;
  pbVar29 = pbVar31;
  goto LAB_00120aaa;
LAB_00120b70:
  if (lVar18 != 0) {
    lVar18 = lVar18 + -1;
    goto LAB_00120b2c;
  }
  goto LAB_00120af4;
LAB_00120fcc:
  if ((options & 2) != 0) {
    *pbVar29 = 0;
  }
  pbVar29 = pbVar29 + (ulong)(bVar13 == 0x3e) + 2;
  goto LAB_0012045e;
LAB_00120feb:
  pbVar32 = pbVar31;
  if (pbVar29 != (byte *)0x0) {
    memmove(pbVar29 + -lVar20,pbVar29,(long)pbVar31 - (long)pbVar29);
    pbVar32 = pbVar31 + -lVar20;
  }
  *pbVar32 = 0;
  pbVar29 = pbVar31 + (ulong)(pbVar31[2] == 0x3e) + 2;
  goto LAB_0012045e;
LAB_00120d0d:
  pbVar34 = pbVar34 + (ulong)(bVar13 == 0x3e) + 1;
  goto LAB_00120e94;
LAB_00120d8e:
  if (bVar35) {
    pbVar29[-1] = 0x2f;
  }
  else {
    local_a8->value = (char_t *)pbVar34;
    local_a8 = local_a8->parent;
    pbVar29[-1] = 0;
    pbVar34 = pbVar29 + (*pbVar29 == 0x3e);
  }
LAB_00120e94:
  pbVar29 = pbVar34;
  if ((local_a8->header & 0xf) != 7) goto LAB_0012045e;
LAB_00120ea7:
  while( true ) {
    do {
      pbVar32 = pbVar34;
      bVar13 = *pbVar32;
      pbVar34 = pbVar32 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar13]) break;
    pxVar10 = append_new_attribute(local_a8,alloc);
    if (pxVar10 == (xml_attribute_struct *)0x0) goto LAB_001212a8;
    pxVar10->name = (char_t *)pbVar32;
    pbVar29 = pbVar32 + 1;
    do {
      pbVar34 = pbVar29;
      bVar13 = pbVar34[-1];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) {
        pbVar34 = pbVar34 + -1;
        goto LAB_00120f28;
      }
      bVar13 = *pbVar34;
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) goto LAB_00120f28;
      bVar13 = pbVar34[1];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) {
        pbVar34 = pbVar34 + 1;
        goto LAB_00120f28;
      }
      bVar13 = pbVar34[2];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      pbVar29 = pbVar34 + 4;
    } while ((bVar14 & 0x40) != 0);
    pbVar34 = pbVar34 + 2;
LAB_00120f28:
    *pbVar34 = 0;
    while (pbVar34 = pbVar34 + 1, (bVar14 & 8) != 0) {
      bVar13 = *pbVar34;
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
    }
    pbVar29 = pbVar34;
    if (bVar13 != 0x3d) goto LAB_001212b5;
    do {
      pbVar34 = pbVar29;
      bVar13 = *pbVar34;
      pbVar29 = pbVar34 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
    if ((bVar13 != 0x22) && (bVar13 != 0x27)) goto LAB_001212b5;
    pxVar10->value = (char_t *)pbVar29;
    pbVar34 = (byte *)(*pcVar2)(pbVar29);
    if (pbVar34 == (byte *)0x0) {
      pbVar34 = (byte *)pxVar10->value;
      goto LAB_001212b5;
    }
    if ((char)(anonymous_namespace)::chartype_table[*pbVar34] < '\0') {
LAB_001212b5:
      xVar26 = status_bad_attribute;
      pbVar29 = pbVar34;
      goto LAB_0012139c;
    }
  }
  pbVar29 = pbVar34;
  if (bVar13 == 0x3e) goto LAB_0012045e;
  if (bVar13 == 0x2f) {
    if (*pbVar34 == 0x3e) {
      local_a8 = local_a8->parent;
      pbVar29 = pbVar32 + 2;
      goto LAB_0012045e;
    }
    pbVar32 = pbVar34;
    if ((bVar1 == 0x3e) && (*pbVar34 == 0)) {
      local_a8 = local_a8->parent;
      goto LAB_0012045e;
    }
  }
  else if ((bVar1 == 0x3e) && (pbVar29 = pbVar32, bVar13 == 0)) goto LAB_0012045e;
LAB_0012147f:
  xVar26 = status_bad_start_element;
  pbVar29 = pbVar32;
  goto LAB_0012139c;
code_r0x00120933:
  local_a8 = local_a8->parent;
  do {
    pbVar31 = pbVar29;
    bVar13 = *pbVar31;
    pbVar29 = pbVar31 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
  pbVar29 = pbVar31;
  bVar14 = bVar1;
  if (bVar13 != 0) {
    pbVar29 = pbVar31 + 1;
    bVar14 = bVar13;
  }
  if (bVar14 != 0x3e) goto LAB_00121469;
  goto LAB_0012045e;
LAB_00121469:
  xVar26 = status_bad_end_element;
  pbVar29 = pbVar31;
LAB_0012139c:
  pbVar11 = pbVar29 + -(long)pbVar11;
  if (pbVar29 != (byte *)0x0) {
    pbVar29 = pbVar11;
  }
  pbVar31 = pbVar29;
  if (xVar26 == status_ok) {
    if (bVar1 == 0x3c) {
      __return_storage_ptr__->status = status_unrecognized_tag;
LAB_00121427:
      __return_storage_ptr__->offset = (ptrdiff_t)(size - 1);
      goto LAB_0012142b;
    }
    if ((options >> 0xc & 1) == 0) {
      ppxVar12 = &local_70->next_sibling;
      if (local_70 == (xml_node_struct *)0x0) {
        ppxVar12 = &root->first_child;
      }
      do {
        pxVar9 = *ppxVar12;
        if (pxVar9 == (xml_node_struct *)0x0) {
          __return_storage_ptr__->status = status_no_document_element;
          goto LAB_00121427;
        }
        ppxVar12 = &pxVar9->next_sibling;
      } while ((pxVar9->header & 0xf) != 2);
    }
  }
  else if (0 < (long)pbVar29) {
    pbVar31 = pbVar29 + -1;
    if (bVar1 != 0) {
      pbVar31 = pbVar11;
    }
    if (pbVar29 != (byte *)(size - 1)) {
      pbVar31 = pbVar11;
    }
  }
  __return_storage_ptr__->status = xVar26;
  __return_storage_ptr__->offset = (ptrdiff_t)pbVar31;
LAB_0012142b:
  __return_storage_ptr__->encoding = xVar4;
LAB_00121437:
  auto_deleter<void>::~auto_deleter(&contents_guard);
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}